

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void logevent_internal(LogContext *ctx,char *event)

{
  if (ctx->logtype - 3U < 2) {
    logprintf(ctx,"Event Log: %s\r\n",event);
    if ((0 < ctx->logtype) && (ctx->state == L_OPEN)) {
      fflush((FILE *)ctx->lgfp);
    }
  }
  (*ctx->lp->vt->eventlog)(ctx->lp,event);
  return;
}

Assistant:

static void logevent_internal(LogContext *ctx, const char *event)
{
    if (ctx->logtype == LGTYP_PACKETS || ctx->logtype == LGTYP_SSHRAW) {
        logprintf(ctx, "Event Log: %s\r\n", event);
        logflush(ctx);
    }
    lp_eventlog(ctx->lp, event);
}